

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Float pbrt::SphericalTriangleArea(Vector3f *a,Vector3f *b,Vector3f *c)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float local_9c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  fVar10 = (b->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar19 = (a->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar17 = (b->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar21 = (a->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar11 = (a->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar18 = (b->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar23 = ZEXT416((uint)fVar10);
  auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar21),
                           ZEXT416((uint)(fVar10 * fVar19)));
  auVar22 = ZEXT416((uint)fVar19);
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar19)),auVar22,auVar23);
  fVar29 = auVar9._0_4_ + auVar16._0_4_;
  auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar18),auVar22,ZEXT416((uint)(fVar17 * fVar11)));
  auVar15 = ZEXT416((uint)fVar11);
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar11)),auVar15,ZEXT416((uint)fVar17));
  fVar27 = auVar9._0_4_ + auVar16._0_4_;
  auVar9 = vfmsub213ss_fma(auVar23,auVar15,ZEXT416((uint)(fVar18 * fVar21)));
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar21)),ZEXT416((uint)fVar21),
                             ZEXT416((uint)fVar18));
  fVar25 = auVar9._0_4_ + auVar16._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),ZEXT416((uint)fVar29),
                           ZEXT416((uint)fVar29));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
  if ((auVar9._0_4_ != 0.0) || (NAN(auVar9._0_4_))) {
    fVar20 = (c->super_Tuple3<pbrt::Vector3,_float>).z;
    fVar1 = (c->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar2 = (c->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar8 = ZEXT416((uint)fVar18);
    auVar5 = vmulss_avx512f(auVar8,ZEXT416((uint)fVar20));
    auVar6 = vmulss_avx512f(auVar23,ZEXT416((uint)fVar2));
    auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar20),auVar23,ZEXT416((uint)(fVar17 * fVar1)));
    auVar24 = ZEXT416((uint)fVar1);
    auVar23 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar1)),ZEXT416((uint)fVar17),auVar24);
    auVar7 = vfmsub213ss_avx512f(ZEXT416((uint)fVar17),ZEXT416((uint)fVar2),auVar5);
    auVar28 = ZEXT416((uint)fVar20);
    auVar5 = vfnmadd231ss_avx512f(auVar5,auVar8,auVar28);
    auVar8 = vfmsub213ss_avx512f(auVar8,auVar24,auVar6);
    auVar26 = ZEXT416((uint)fVar2);
    auVar6 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar10),auVar26,auVar6);
    auVar5 = vaddss_avx512f(auVar5,auVar7);
    fVar10 = auVar8._0_4_ + auVar6._0_4_;
    fVar17 = auVar16._0_4_ + auVar23._0_4_;
    fVar18 = auVar5._0_4_;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),ZEXT416((uint)fVar17),
                              ZEXT416((uint)fVar17));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
    if ((auVar16._0_4_ != 0.0) || (NAN(auVar16._0_4_))) {
      auVar23 = vfmsub213ss_fma(auVar22,auVar24,ZEXT416((uint)(fVar20 * fVar21)));
      auVar5 = vfnmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar21)),auVar28,ZEXT416((uint)fVar21));
      fVar20 = auVar23._0_4_ + auVar5._0_4_;
      auVar23 = vfmsub213ss_fma(auVar28,auVar15,ZEXT416((uint)(fVar2 * fVar19)));
      auVar5 = vfnmadd213ss_fma(auVar22,auVar26,ZEXT416((uint)(fVar2 * fVar19)));
      auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar21),auVar26,ZEXT416((uint)(fVar1 * fVar11)));
      auVar15 = vfnmadd213ss_fma(auVar15,auVar24,ZEXT416((uint)(fVar1 * fVar11)));
      fVar19 = auVar23._0_4_ + auVar5._0_4_;
      fVar21 = auVar22._0_4_ + auVar15._0_4_;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),ZEXT416((uint)fVar20),
                                ZEXT416((uint)fVar20));
      auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        fVar11 = auVar9._0_4_;
        fVar29 = fVar29 / fVar11;
        auVar9 = vsqrtss_avx(auVar16,auVar16);
        fVar27 = fVar27 / fVar11;
        fVar25 = fVar25 / fVar11;
        fVar11 = auVar9._0_4_;
        fVar17 = fVar17 / fVar11;
        fVar18 = fVar18 / fVar11;
        fVar10 = fVar10 / fVar11;
        auVar9 = vsqrtss_avx(auVar15,auVar15);
        fVar11 = auVar9._0_4_;
        fVar19 = fVar19 / fVar11;
        fVar20 = fVar20 / fVar11;
        fVar21 = fVar21 / fVar11;
        auVar9 = vfnmsub231ss_fma(ZEXT416((uint)(fVar27 * fVar19)),ZEXT416((uint)fVar29),
                                  ZEXT416((uint)fVar20));
        auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar25),ZEXT416((uint)fVar21));
        if (0.0 <= auVar9._0_4_) {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((-fVar19 - fVar27) * (-fVar19 - fVar27))),
                                   ZEXT416((uint)(-fVar20 - fVar29)),
                                   ZEXT416((uint)(-fVar20 - fVar29)));
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(-fVar21 - fVar25)),
                                   ZEXT416((uint)(-fVar21 - fVar25)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          local_9c = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          local_9c = local_9c + local_9c;
        }
        else {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((fVar27 - fVar19) * (fVar27 - fVar19))),
                                   ZEXT416((uint)(fVar29 - fVar20)),ZEXT416((uint)(fVar29 - fVar20))
                                  );
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(fVar25 - fVar21)),
                                   ZEXT416((uint)(fVar25 - fVar21)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar12._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          auVar12._4_60_ = extraout_var;
          auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar12._0_16_,ZEXT416(0x40490fdb)
                                  );
          local_9c = auVar9._0_4_;
        }
        auVar9 = vfnmsub231ss_fma(ZEXT416((uint)(fVar18 * fVar27)),ZEXT416((uint)fVar17),
                                  ZEXT416((uint)fVar29));
        auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar10),ZEXT416((uint)fVar25));
        if (0.0 <= auVar9._0_4_) {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((-fVar27 - fVar18) * (-fVar27 - fVar18))),
                                   ZEXT416((uint)(-fVar29 - fVar17)),
                                   ZEXT416((uint)(-fVar29 - fVar17)));
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(-fVar25 - fVar10)),
                                   ZEXT416((uint)(-fVar25 - fVar10)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar11 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          fVar11 = fVar11 + fVar11;
        }
        else {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((fVar18 - fVar27) * (fVar18 - fVar27))),
                                   ZEXT416((uint)(fVar17 - fVar29)),ZEXT416((uint)(fVar17 - fVar29))
                                  );
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(fVar10 - fVar25)),
                                   ZEXT416((uint)(fVar10 - fVar25)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar13._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          auVar13._4_60_ = extraout_var_00;
          auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar13._0_16_,ZEXT416(0x40490fdb)
                                  );
          fVar11 = auVar9._0_4_;
        }
        auVar9 = vfnmsub231ss_fma(ZEXT416((uint)(fVar19 * fVar18)),ZEXT416((uint)fVar20),
                                  ZEXT416((uint)fVar17));
        auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar21),ZEXT416((uint)fVar10));
        if (0.0 <= auVar9._0_4_) {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((-fVar18 - fVar19) * (-fVar18 - fVar19))),
                                   ZEXT416((uint)(-fVar17 - fVar20)),
                                   ZEXT416((uint)(-fVar17 - fVar20)));
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(-fVar10 - fVar21)),
                                   ZEXT416((uint)(-fVar10 - fVar21)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar10 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          fVar10 = fVar10 + fVar10;
        }
        else {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)((fVar19 - fVar18) * (fVar19 - fVar18))),
                                   ZEXT416((uint)(fVar20 - fVar17)),ZEXT416((uint)(fVar20 - fVar17))
                                  );
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(fVar21 - fVar10)),
                                   ZEXT416((uint)(fVar21 - fVar10)));
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          auVar16 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar3 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          auVar14._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
          auVar14._4_60_ = extraout_var_01;
          auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar14._0_16_,ZEXT416(0x40490fdb)
                                  );
          fVar10 = auVar9._0_4_;
        }
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar9 = vandps_avx512vl(ZEXT416((uint)(fVar11 + local_9c + fVar10 + -3.1415927)),auVar9);
        return auVar9._0_4_;
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}